

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O0

uint __thiscall
Mapper::mapLabel(Mapper *this,string *label,uint instructionIndex,
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *labelMap,
                vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions,
                int64_t *value)

{
  ulong uVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  ostream *poVar4;
  ulong local_b8;
  int unAssembled_1;
  size_t instructionLength_1;
  uint i_1;
  int unAssembled;
  size_t instructionLength;
  ulong uStack_70;
  uint i;
  int64_t delta;
  out_of_range anon_var_0;
  size_t labelIndex;
  int64_t *value_local;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *labelMap_local;
  uint instructionIndex_local;
  string *label_local;
  Mapper *this_local;
  
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::at(labelMap,label);
  uVar1 = *pmVar2;
  if (uVar1 == instructionIndex) {
    this_local._4_4_ = 0;
  }
  else {
    if (instructionIndex < uVar1) {
      pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                         (instructions,(ulong)instructionIndex);
      if (pvVar3->length == 0) {
        local_b8 = 10;
      }
      else {
        pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                           (instructions,(ulong)instructionIndex);
        local_b8 = (ulong)pvVar3->length;
      }
      uStack_70 = local_b8;
      for (instructionLength._4_4_ = instructionIndex + 1; instructionLength._4_4_ < uVar1;
          instructionLength._4_4_ = instructionLength._4_4_ + 1) {
        pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                           (instructions,(ulong)instructionLength._4_4_);
        if ((ulong)pvVar3->length == 0) {
          return 0;
        }
        uStack_70 = pvVar3->length + uStack_70;
      }
    }
    else {
      uStack_70 = 0;
      for (instructionLength_1._0_4_ = instructionIndex - 1; uVar1 <= (uint)instructionLength_1;
          instructionLength_1._0_4_ = (uint)instructionLength_1 - 1) {
        pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                           (instructions,(ulong)(uint)instructionLength_1);
        if ((ulong)pvVar3->length == 0) {
          return 0;
        }
        uStack_70 = pvVar3->length + uStack_70;
        if ((uint)instructionLength_1 == 0) break;
      }
      uStack_70 = -uStack_70;
    }
    *value = uStack_70;
    poVar4 = std::operator<<((ostream *)&std::cout,"delta ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uStack_70);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                       (instructions,(ulong)instructionIndex);
    if (pvVar3->length == 0) {
      if ((*value < -0x80) || (0x7f < *value)) {
        if ((*value < -0x8000) || (0x7ffe < *value)) {
          if ((*value < -0x80000000) || (0x7ffffffe < *value)) {
            this_local._4_4_ = 8;
          }
          else {
            if (0 < (long)uStack_70) {
              *value = *value + -3;
            }
            this_local._4_4_ = 4;
          }
        }
        else {
          if (0 < (long)uStack_70) {
            *value = *value + -1;
          }
          this_local._4_4_ = 2;
        }
      }
      else {
        if (0 < (long)uStack_70) {
          *value = *value + -7;
        }
        this_local._4_4_ = 1;
      }
    }
    else {
      pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                         (instructions,(ulong)instructionIndex);
      this_local._4_4_ = pvVar3->length - 2;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int Mapper::mapLabel(std::string label, unsigned int instructionIndex, std::unordered_map<std::string, size_t> labelMap,
	std::vector<AssemberInstruction> &instructions, int64_t &value) {

	size_t labelIndex;
	try {
		labelIndex = labelMap.at(label);
	}
	catch (std::out_of_range) {
		return 0;
	}
	if (labelIndex == instructionIndex) {
		return 0;
	}
	int64_t delta;
	if (labelIndex > instructionIndex) {
		delta = (instructions[instructionIndex].length) ? instructions[instructionIndex].length : sizeof(uint64_t) + 2; // assume max length for the jump instruction (10 bytes)
		for (unsigned int i = instructionIndex + 1; i < labelIndex; i++) {
			size_t instructionLength = instructions[i].length;
			int unAssembled = 0;
			if (instructionLength == 0) {
				// Instruction hasn't been assembled yet because it contains label that hasn't been resolved, thus it's length is unknown
				unAssembled++;
				return 0;
			}
			else {
				delta += instructionLength;
			}
			if (unAssembled) {
				// assume the unassembled instructions will take max space
				delta += (unAssembled * (2 + sizeof(uint64_t)));
			}
		}
	}
	else {
		delta = 0; // assume max length for the jump instruction (10 bytes)
		for (unsigned int i = instructionIndex - 1; i >= labelIndex; i--) {
			size_t instructionLength = instructions[i].length;
			int unAssembled = 0;
			if (instructionLength == 0) {
				// Instruction hasn't been assembled yet because it contains label that hasn't been resolved, thus it's length is unknown
				unAssembled++;
				return 0;
			}
			else {
				delta += instructionLength;
			}
			if (unAssembled) {
				// assume the unassembled instructions will take max space
				delta += (unAssembled * (2 + sizeof(uint64_t)));
			}
			if (i == 0)
				break;
		}
		delta = -delta;
	}
	value = delta;
	std::cout << "delta " << delta << std::endl;
	if (instructions[instructionIndex].length) {
		return instructions[instructionIndex].length - 2;
	}
	if (SCHAR_MIN <= value && value <= SCHAR_MAX) {
		if (delta > 0)
			value -= (sizeof(int64_t) - sizeof(int8_t));
		return sizeof(int8_t);
	}
	else if (SHRT_MIN <= value && value <= SHRT_MAX - 1) {
		if (delta > 0)
			value -= sizeof(int16_t) - sizeof(int8_t);
		return sizeof(int16_t);
	}
	else if (INT32_MIN <= value && value <= INT32_MAX - 1) {
		if (delta > 0)
			value -= sizeof(int32_t) - sizeof(int8_t);
		return sizeof(int32_t);
	}
	return sizeof(int64_t);
}